

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

void __thiscall
highs::RbTree<HighsNodeQueue::NodeLowerRbTree>::deleteFixup
          (RbTree<HighsNodeQueue::NodeLowerRbTree> *this,LinkType x,LinkType nilParent)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  LinkType x_00;
  
  x_00 = x;
  if (*this->rootNode != x) {
    do {
      x = x_00;
      lVar5 = this[2].rootNode[1];
      x_00 = nilParent;
      if (x != -1) {
        uVar8 = *(ulong *)(lVar5 + 0x70 + x * 0x90);
        if ((long)uVar8 < 0) goto LAB_002ccfa2;
        x_00 = uVar8 - 1;
      }
      lVar10 = x_00 * 0x90;
      lVar2 = *(long *)(lVar5 + 0x60 + lVar10);
      uVar8 = (ulong)(x == lVar2);
      lVar7 = *(long *)(lVar5 + lVar10 + 0x60 + uVar8 * 8);
      if (lVar7 == -1) {
        lVar7 = -1;
      }
      else {
        uVar3 = *(ulong *)(lVar5 + 0x70 + lVar7 * 0x90);
        if ((long)uVar3 < 0) {
          *(ulong *)(lVar5 + lVar7 * 0x90 + 0x70) = uVar3 & 0x7fffffffffffffff;
          puVar1 = (ulong *)(lVar5 + 0x70 + x_00 * 0x90);
          *puVar1 = *puVar1 | 0x8000000000000000;
          rotate(this,x_00,(uint)(x != lVar2));
          lVar5 = this[2].rootNode[1];
          lVar7 = *(LinkType *)(x_00 * 0x90 + lVar5 + 0x60 + uVar8 * 8);
        }
      }
      lVar6 = lVar7 * 0x90;
      plVar9 = (long *)(lVar5 + lVar6 + 0x60);
      if (((*plVar9 != -1) && (*(long *)(lVar5 + 0x70 + *plVar9 * 0x90) < 0)) ||
         ((lVar4 = *(long *)(lVar5 + lVar6 + 0x68), lVar4 != -1 &&
          (*(long *)(lVar5 + 0x70 + lVar4 * 0x90) < 0)))) {
        if ((plVar9[uVar8] == -1) || (-1 < *(long *)(lVar5 + 0x70 + plVar9[uVar8] * 0x90))) {
          puVar1 = (ulong *)(lVar5 + 0x70 + plVar9[x != lVar2] * 0x90);
          *puVar1 = *puVar1 & 0x7fffffffffffffff;
          puVar1 = (ulong *)(lVar5 + 0x70 + lVar6);
          *puVar1 = *puVar1 | 0x8000000000000000;
          rotate(this,lVar7,(uint)(x == lVar2));
          lVar5 = this[2].rootNode[1];
          lVar7 = *(long *)(lVar5 + lVar10 + 0x60 + uVar8 * 8);
        }
        lVar7 = lVar7 * 0x90;
        *(ulong *)(lVar5 + 0x70 + lVar7) =
             *(ulong *)(lVar5 + 0x70 + lVar10) & 0x8000000000000000 |
             *(ulong *)(lVar5 + 0x70 + lVar7) & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar5 + 0x70 + lVar10);
        *puVar1 = *puVar1 & 0x7fffffffffffffff;
        puVar1 = (ulong *)(lVar5 + 0x70 + *(long *)(lVar7 + lVar5 + 0x60 + uVar8 * 8) * 0x90);
        *puVar1 = *puVar1 & 0x7fffffffffffffff;
        rotate(this,x_00,(uint)(x != lVar2));
        x = *this->rootNode;
        break;
      }
      puVar1 = (ulong *)(lVar5 + 0x70 + lVar6);
      *puVar1 = *puVar1 | 0x8000000000000000;
      x = *this->rootNode;
    } while (x_00 != x);
  }
  if (x != -1) {
    lVar5 = this[2].rootNode[1];
    uVar8 = *(ulong *)(lVar5 + 0x70 + x * 0x90);
LAB_002ccfa2:
    *(ulong *)(lVar5 + 0x70 + x * 0x90) = uVar8 & 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }